

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

PropertySymOpnd * IR::PropertySymOpnd::New(PropertySym *propertySym,IRType type,Func *func)

{
  undefined1 *puVar1;
  Type in_RAX;
  PropertySymOpnd *this;
  JITTypeHolderBase<void> local_28;
  
  local_28.t = in_RAX;
  this = (PropertySymOpnd *)new<Memory::JitArenaAllocator>(0x68,func->m_alloc,0x3eba5c);
  PropertySymOpnd(this);
  (this->super_SymOpnd).m_sym = &propertySym->super_Sym;
  (this->super_SymOpnd).m_offset = 0;
  (this->super_SymOpnd).super_Opnd.m_type = type;
  this->objTypeSpecFldInfo = (ObjTypeSpecFldInfo *)0x0;
  this->field_0x61 = this->field_0x61 & 0xfe;
  this->slotIndex = 0;
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_28,(JITType *)0x0);
  (this->finalType).t = local_28.t;
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_28,(JITType *)0x0);
  (this->monoGuardType).t = local_28.t;
  this->guardedPropOps = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->writeGuards = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  puVar1 = &(this->super_SymOpnd).super_Opnd.field_0xb;
  *puVar1 = *puVar1 | 0x40;
  this->checkedTypeSetIndex = 0xffff;
  this->field_12 = (anon_union_2_2_18881db1_for_PropertySymOpnd_13)0x0;
  (this->super_SymOpnd).super_Opnd.m_kind = OpndKindSym;
  return this;
}

Assistant:

PropertySymOpnd *
PropertySymOpnd::New(PropertySym *propertySym, IRType type, Func *func)
{
    PropertySymOpnd *newOpnd = JitAnew(func->m_alloc, IR::PropertySymOpnd);
    newOpnd->m_sym = propertySym;
    newOpnd->m_offset = 0;
    newOpnd->m_type = type;
    newOpnd->SetObjTypeSpecFldInfo(nullptr);
    newOpnd->finalType = JITTypeHolder(nullptr);
    newOpnd->monoGuardType = JITTypeHolder(nullptr);
    newOpnd->guardedPropOps = nullptr;
    newOpnd->writeGuards = nullptr;
    newOpnd->objTypeSpecFlags = 0;
    newOpnd->isPropertySymOpnd = true;
    newOpnd->checkedTypeSetIndex = (uint16)-1;

    newOpnd->m_kind = OpndKindSym;

    return newOpnd;
}